

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O2

void __thiscall
acto::actor::fun_handler_t<msg_out,_acto::actor_ref,_const_msg_out_&>::invoke
          (fun_handler_t<msg_out,_acto::actor_ref,_const_msg_out_&> *this,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  actor_ref local_20;
  
  actor_ref::actor_ref
            (&local_20,
             ((msg->_M_t).
              super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t
              .super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
              super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl)->sender,true);
  std::function<void_(acto::actor_ref,_const_msg_out_&)>::operator()
            (&this->func_,&local_20,
             (msg_out *)
             ((msg->_M_t).
              super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t
              .super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
              super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl + 1));
  actor_ref::~actor_ref(&local_20);
  return;
}

Assistant:

void invoke(std::unique_ptr<core::msg_t> msg) const final {
      if constexpr (sizeof...(Args) == 0) {
        func_();
      } else if constexpr (sizeof...(Args) == 1) {
        using P0 = std::tuple_element_t<0, std::tuple<Args...>>;

        if constexpr (std::is_same_v<actor_ref, std::decay_t<P0>>) {
          func_(actor_ref(msg->sender, true));
        } else {
          func_(static_cast<message_reference_t<M, P0>>(*msg.get()).data());
        }
      } else if constexpr (sizeof...(Args) == 2) {
        using P1 = std::tuple_element_t<1, std::tuple<Args...>>;

        func_(actor_ref(msg->sender, true),
              static_cast<message_reference_t<M, P1>>(*msg.get()).data());
      }
    }